

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QStringList * __thiscall
QCommandLineParserPrivate::aliases
          (QStringList *__return_storage_ptr__,QCommandLineParserPrivate *this,QString *optionName)

{
  Span *pSVar1;
  ushort *puVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  const_iterator cVar4;
  QMessageLogger local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar4 = QHash<QString,_long_long>::constFindImpl<QString>(&this->nameHash,optionName);
  if (cVar4.i.d == (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 && cVar4.i.bucket == 0) {
    local_40.context.version = 2;
    local_40.context.function._4_4_ = 0;
    local_40.context._4_8_ = 0;
    local_40.context._12_8_ = 0;
    local_40.context.category = "default";
    puVar2 = QString::utf16(optionName);
    QMessageLogger::warning(&local_40,"QCommandLineParser: option not defined: \"%ls\"",puVar2);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0038e061;
  }
  else {
    pSVar1 = (cVar4.i.d)->spans;
    uVar3 = cVar4.i.bucket >> 7;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0038e061:
      __stack_chk_fail();
    }
    QCommandLineOption::names
              (__return_storage_ptr__,
               (this->commandLineOptionList).d.ptr +
               *(long *)(pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)cVar4.i.bucket & 0x7f]].
                         storage.data + 0x18));
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QCommandLineParserPrivate::aliases(const QString &optionName) const
{
    const NameHash_t::const_iterator it = nameHash.constFind(optionName);
    if (it == nameHash.cend()) {
        qWarning("QCommandLineParser: option not defined: \"%ls\"", qUtf16Printable(optionName));
        return QStringList();
    }
    return commandLineOptionList.at(*it).names();
}